

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

float cnn::TensorTools::AccessElement(Tensor *v,int index)

{
  int index_local;
  Tensor *v_local;
  
  return v->v[index];
}

Assistant:

float TensorTools::AccessElement(const Tensor& v, int index) {
#if HAVE_CUDA
  float ret;
  cudaMemcpyAsync(&ret, &v.v[index], sizeof(real), cudaMemcpyDeviceToHost);
  return ret;
#else
  return v.v[index];
#endif
}